

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptMath.cpp
# Opt level: O3

Var Js::JavascriptMath::Multiply_Full(Var aLeft,Var aRight,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  RecyclableObject *pRVar5;
  Var pvVar6;
  Type TVar7;
  Type TVar8;
  double dVar9;
  double dVar10;
  
  if (aLeft == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/../Math/JavascriptMath.cpp"
                                ,0x3b5,"(aLeft != nullptr)","aLeft != nullptr");
    if (!bVar2) goto LAB_00aa091e;
    *puVar4 = 0;
  }
  if (aRight == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/../Math/JavascriptMath.cpp"
                                ,0x3b6,"(aRight != nullptr)","aRight != nullptr");
    if (!bVar2) goto LAB_00aa091e;
    *puVar4 = 0;
  }
  if (scriptContext == (ScriptContext *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/../Math/JavascriptMath.cpp"
                                ,0x3b7,"(scriptContext != nullptr)","scriptContext != nullptr");
    if (!bVar2) goto LAB_00aa091e;
    *puVar4 = 0;
  }
  if (aLeft == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar2) goto LAB_00aa091e;
    *puVar4 = 0;
LAB_00aa0409:
    pRVar5 = UnsafeVarTo<Js::RecyclableObject>(aLeft);
    if (pRVar5 == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar2) goto LAB_00aa091e;
      *puVar4 = 0;
    }
    TVar7 = ((pRVar5->type).ptr)->typeId;
    if (0x57 < (int)TVar7) {
      BVar3 = RecyclableObject::IsExternal(pRVar5);
      if (BVar3 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar4 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                    "GetTypeId aValue has invalid TypeId");
        if (!bVar2) goto LAB_00aa091e;
        goto LAB_00aa04df;
      }
    }
  }
  else if (((ulong)aLeft & 0x1ffff00000000) == 0x1000000000000 ||
           ((ulong)aLeft & 0xffff000000000000) != 0x1000000000000) {
    TVar7 = TypeIds_FirstNumberType;
    if ((((ulong)aLeft & 0xffff000000000000) != 0x1000000000000) &&
       (TVar7 = TypeIds_Number, (ulong)aLeft >> 0x32 == 0)) goto LAB_00aa0409;
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar2) goto LAB_00aa091e;
    TVar7 = TypeIds_FirstNumberType;
LAB_00aa04df:
    *puVar4 = 0;
  }
  if (aRight == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar2) goto LAB_00aa091e;
    *puVar4 = 0;
LAB_00aa05f1:
    pRVar5 = UnsafeVarTo<Js::RecyclableObject>(aRight);
    if (pRVar5 == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar2) goto LAB_00aa091e;
      *puVar4 = 0;
    }
    TVar8 = ((pRVar5->type).ptr)->typeId;
    if (0x57 < (int)TVar8) {
      BVar3 = RecyclableObject::IsExternal(pRVar5);
      if (BVar3 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar4 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                    "GetTypeId aValue has invalid TypeId");
        if (!bVar2) goto LAB_00aa091e;
        goto LAB_00aa06c3;
      }
    }
  }
  else if (((ulong)aRight & 0x1ffff00000000) == 0x1000000000000 ||
           ((ulong)aRight & 0xffff000000000000) != 0x1000000000000) {
    TVar8 = TypeIds_FirstNumberType;
    if ((((ulong)aRight & 0xffff000000000000) != 0x1000000000000) &&
       (TVar8 = TypeIds_Number, (ulong)aRight >> 0x32 == 0)) goto LAB_00aa05f1;
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar2) goto LAB_00aa091e;
    TVar8 = TypeIds_FirstNumberType;
LAB_00aa06c3:
    *puVar4 = 0;
  }
  if ((TVar7 == TypeIds_BigInt) || (TVar8 == TypeIds_BigInt)) {
    if (TVar8 == TVar7) {
      pvVar6 = JavascriptBigInt::Mul(aLeft,aRight);
      return pvVar6;
    }
    JavascriptError::ThrowTypeError(scriptContext,-0x7ff5fff3,L"Multiply BigInt");
  }
  if ((ulong)aLeft >> 0x32 == 0) {
    if (aRight < (Var)0x4000000000000) {
      bVar2 = TaggedInt::IsPair(aLeft,aRight);
      if (bVar2) {
        pvVar6 = TaggedInt::Multiply(aLeft,aRight,scriptContext);
        return pvVar6;
      }
LAB_00aa08fa:
      dVar10 = Multiply_Helper(aLeft,aRight,scriptContext);
      pvVar6 = JavascriptNumber::ToVarIntCheck(dVar10,scriptContext);
      return pvVar6;
    }
    if (((ulong)aLeft & 0x1ffff00000000) == 0x1000000000000 ||
        ((ulong)aLeft & 0xffff000000000000) != 0x1000000000000) {
      if (((ulong)aLeft & 0xffff000000000000) != 0x1000000000000) goto LAB_00aa08fa;
    }
    else {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                  "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar2) goto LAB_00aa091e;
      *puVar4 = 0;
    }
    dVar10 = (double)(int)aLeft;
  }
  else {
    if (aRight < (Var)0x4000000000000) {
      if (((ulong)aRight & 0x1ffff00000000) == 0x1000000000000 ||
          ((ulong)aRight & 0xffff000000000000) != 0x1000000000000) {
        if (((ulong)aRight & 0xffff000000000000) != 0x1000000000000) goto LAB_00aa08fa;
      }
      else {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar4 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                    ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                    "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
        if (!bVar2) {
LAB_00aa091e:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar4 = 0;
      }
      dVar10 = (double)(int)aRight;
      dVar9 = (double)((ulong)aLeft ^ 0xfffc000000000000);
      goto LAB_00aa08e0;
    }
    dVar10 = (double)((ulong)aLeft ^ 0xfffc000000000000);
  }
  dVar9 = (double)((ulong)aRight ^ 0xfffc000000000000);
LAB_00aa08e0:
  pvVar6 = JavascriptNumber::ToVarNoCheck(dVar9 * dVar10,scriptContext);
  return pvVar6;
}

Assistant:

Var JavascriptMath::Multiply_Full(Var aLeft, Var aRight, ScriptContext* scriptContext)
        {
            JIT_HELPER_REENTRANT_HEADER(Op_Multiply_Full);
            Assert(aLeft != nullptr);
            Assert(aRight != nullptr);
            Assert(scriptContext != nullptr);

            Js::TypeId typeLeft = JavascriptOperators::GetTypeId(aLeft);
            Js::TypeId typeRight = JavascriptOperators::GetTypeId(aRight);
            if (typeLeft == TypeIds_BigInt || typeRight == TypeIds_BigInt)
            {
                if (typeRight != typeLeft)
                {
                    JavascriptError::ThrowTypeError(scriptContext, VBSERR_TypeMismatch, _u("Multiply BigInt"));
                }
                return JavascriptBigInt::Mul(aLeft, aRight);
            }

            if(JavascriptNumber::Is(aLeft))
            {
                if(JavascriptNumber::Is(aRight))
                {
                    double product = JavascriptNumber::GetValue(aLeft) * JavascriptNumber::GetValue(aRight);
                    return JavascriptNumber::ToVarNoCheck(product, scriptContext);
                }
                else if(TaggedInt::Is(aRight))
                {
                    double product = TaggedInt::ToDouble(aRight) * JavascriptNumber::GetValue(aLeft);
                    return JavascriptNumber::ToVarNoCheck(product, scriptContext);
                }
            }
            else if(JavascriptNumber::Is(aRight))
            {
                if(TaggedInt::Is(aLeft))
                {
                    double product = TaggedInt::ToDouble(aLeft) * JavascriptNumber::GetValue(aRight);
                    return JavascriptNumber::ToVarNoCheck(product, scriptContext);
                }
            }
            else if(TaggedInt::IsPair(aLeft, aRight))
            {
                return TaggedInt::Multiply(aLeft, aRight, scriptContext);
            }
            double product = Multiply_Helper(aLeft, aRight, scriptContext);
            return JavascriptNumber::ToVarIntCheck(product, scriptContext);
            JIT_HELPER_END(Op_Multiply_Full);
        }